

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# navigationbar.cpp
# Opt level: O0

int __thiscall QtMWidgets::NavigationBarPrivate::init(NavigationBarPrivate *this,EVP_PKEY_CTX *ctx)

{
  NavigationBar *parent;
  QWidget *pQVar1;
  int iVar2;
  QStackedWidget *pQVar3;
  NavigationButton *pNVar4;
  TextLabel *pTVar5;
  QPalette *this_00;
  QColor *c;
  QFont *pQVar6;
  QVBoxLayout *pQVar7;
  QGridLayout *pQVar8;
  QFlags<Qt::AlignmentFlag> local_b8;
  QFlags<Qt::AlignmentFlag> local_b4;
  QFlags<Qt::AlignmentFlag> local_b0;
  QFlags<Qt::AlignmentFlag> local_ac;
  QVBoxLayout *local_a8;
  QVBoxLayout *layout;
  QFont f;
  Alignment local_8c;
  undefined1 local_88 [8];
  QTextOption opt;
  Object local_50 [8];
  code *local_48;
  undefined8 uStack_40;
  code *local_38;
  undefined8 local_30;
  Object local_28 [8];
  WindowFlags local_20 [4];
  NavigationBarPrivate *local_10;
  NavigationBarPrivate *this_local;
  
  local_10 = this;
  QWidget::setBackgroundRole((ColorRole)this->q);
  QWidget::setAutoFillBackground(SUB81(this->q,0));
  pQVar3 = (QStackedWidget *)operator_new(0x28);
  QStackedWidget::QStackedWidget(pQVar3,&this->q->super_QWidget);
  this->stack = pQVar3;
  QFrame::setFrameStyle((int)this->stack);
  pNVar4 = (NavigationButton *)operator_new(0x30);
  NavigationButton::NavigationButton(pNVar4,Left,&this->q->super_QWidget);
  this->left = pNVar4;
  pNVar4 = (NavigationButton *)operator_new(0x30);
  NavigationButton::NavigationButton(pNVar4,Right,&this->q->super_QWidget);
  this->right = pNVar4;
  pTVar5 = (TextLabel *)operator_new(0x30);
  parent = this->q;
  QFlags<Qt::WindowType>::QFlags(local_20);
  TextLabel::TextLabel(pTVar5,&parent->super_QWidget,local_20[0]);
  this->title = pTVar5;
  pTVar5 = this->title;
  this_00 = (QPalette *)QWidget::palette();
  c = QPalette::color(this_00,Highlight);
  TextLabel::setColor(pTVar5,c);
  local_38 = QAbstractButton::clicked;
  local_30 = 0;
  local_48 = NavigationBar::showPreviousScreen;
  uStack_40 = 0;
  QObject::connect<void(QAbstractButton::*)(bool),void(QtMWidgets::NavigationBar::*)()>
            (local_28,(offset_in_QAbstractButton_to_subr)this->left,
             (Object *)QAbstractButton::clicked,0,(ConnectionType)this->q);
  QMetaObject::Connection::~Connection((Connection *)local_28);
  QObject::connect<void(QAbstractButton::*)(bool),void(QtMWidgets::NavigationBar::*)()>
            (local_50,(offset_in_QAbstractButton_to_subr)this->right,
             (Object *)QAbstractButton::clicked,0,(ConnectionType)this->q);
  QMetaObject::Connection::~Connection((Connection *)local_50);
  TextLabel::textOption((TextLabel *)local_88);
  QFlags<Qt::AlignmentFlag>::QFlags(&local_8c,AlignCenter);
  QTextOption::setAlignment((QTextOption *)local_88,local_8c);
  QTextOption::setWrapMode((QTextOption *)local_88,NoWrap);
  TextLabel::setTextOption(this->title,(QTextOption *)local_88);
  pQVar6 = QWidget::font((QWidget *)this->title);
  QFont::QFont((QFont *)&layout,pQVar6);
  QFont::setBold((QFont *)&layout,true);
  QFont::pointSize();
  QFont::setPointSize((int)&layout);
  TextLabel::setFont(this->title,(QFont *)&layout);
  pQVar7 = (QVBoxLayout *)operator_new(0x20);
  QVBoxLayout::QVBoxLayout(pQVar7,&this->q->super_QWidget);
  local_a8 = pQVar7;
  (**(code **)(*(long *)pQVar7 + 0x68))(pQVar7,0);
  QLayout::setContentsMargins((int)local_a8,3,3,3);
  pQVar8 = (QGridLayout *)operator_new(0x20);
  QGridLayout::QGridLayout(pQVar8,(QWidget *)0x0);
  this->grid = pQVar8;
  pNVar4 = this->left;
  pQVar1 = (QWidget *)this->grid;
  QFlags<Qt::AlignmentFlag>::QFlags(&local_ac);
  QGridLayout::addWidget(pQVar1,(int)pNVar4,0,(QFlags_conflict1 *)0x0);
  pTVar5 = this->title;
  pQVar1 = (QWidget *)this->grid;
  QFlags<Qt::AlignmentFlag>::QFlags(&local_b0);
  QGridLayout::addWidget(pQVar1,(int)pTVar5,0,(QFlags_conflict1 *)0x1);
  pNVar4 = this->right;
  pQVar1 = (QWidget *)this->grid;
  QFlags<Qt::AlignmentFlag>::QFlags(&local_b4);
  QGridLayout::addWidget(pQVar1,(int)pNVar4,0,(QFlags_conflict1 *)0x2);
  pQVar8 = this->grid;
  FingerGeometry::height();
  QGridLayout::setRowMinimumHeight((int)pQVar8,0);
  QWidget::hide();
  QWidget::hide();
  QBoxLayout::addLayout((QLayout *)local_a8,(int)this->grid);
  pQVar7 = local_a8;
  pQVar3 = this->stack;
  QFlags<Qt::AlignmentFlag>::QFlags(&local_b8);
  QBoxLayout::addWidget((QWidget *)pQVar7,(int)pQVar3,(QFlags_conflict1 *)0x0);
  QFont::~QFont((QFont *)&layout);
  iVar2 = QTextOption::~QTextOption((QTextOption *)local_88);
  return iVar2;
}

Assistant:

void
NavigationBarPrivate::init()
{
	q->setBackgroundRole( QPalette::Base );
	q->setAutoFillBackground( true );

	stack = new QStackedWidget( q );
	stack->setFrameStyle( QFrame::NoFrame | QFrame::Plain );

	left = new NavigationButton( NavigationButton::Left, q );
	right = new NavigationButton( NavigationButton::Right, q );
	title = new TextLabel( q );
	title->setColor( q->palette().color( QPalette::Highlight ) );

	QObject::connect( left, &NavigationButton::clicked,
		q, &NavigationBar::showPreviousScreen );
	QObject::connect( right, &NavigationButton::clicked,
		q, &NavigationBar::showNextScreen );

	QTextOption opt = title->textOption();
	opt.setAlignment( Qt::AlignCenter );
	opt.setWrapMode( QTextOption::NoWrap );

	title->setTextOption( opt );

	QFont f = title->font();
	f.setBold( true );
	f.setPointSize( f.pointSize() + 1 );

	title->setFont( f );

	QVBoxLayout * layout = new QVBoxLayout( q );
	layout->setSpacing( 0 );
	layout->setContentsMargins( 3, 3, 3, 3 );

	grid = new QGridLayout;
	grid->addWidget( left, 0, 0 );
	grid->addWidget( title, 0, 1 );
	grid->addWidget( right, 0, 2 );
	grid->setRowMinimumHeight( 0, FingerGeometry::height() );

	left->hide();
	right->hide();

	layout->addLayout( grid );
	layout->addWidget( stack );
}